

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O3

CommandOptions * read_PCM_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  uint uVar1;
  undefined1 auVar2 [16];
  MDD_t MVar3;
  uint uVar4;
  long *plVar5;
  undefined8 uVar6;
  AudioDescriptor *pAVar7;
  AESDecContext *this;
  HMACContext *this_00;
  long lVar8;
  Rational RVar9;
  IFileReaderFactory *in_RDX;
  uint uVar10;
  CommandOptions *pCVar11;
  uint uVar12;
  string *this_01;
  bool bVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  MXFReader Reader;
  FrameBuffer FrameBuffer;
  WriterInfo Info;
  Result_t result;
  InterchangeObject *tmp_obj;
  WavFileWriter OutWave;
  undefined1 local_320 [24];
  undefined1 local_308 [40];
  undefined1 local_2e0 [65];
  bool local_29f;
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Alloc_hider local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  int local_230 [26];
  _func_int **local_1c8;
  undefined8 uStack_1c0;
  uint local_1a0;
  WavFileWriter local_158;
  undefined1 local_100 [208];
  
  local_320._16_8_ = Options;
  AS_02::PCM::MXFReader::MXFReader((MXFReader *)local_320,in_RDX);
  ASDCP::FrameBuffer::FrameBuffer((FrameBuffer *)local_308);
  local_308._0_8_ = &PTR__FrameBuffer_00111c60;
  local_158.m_OutFile.super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&local_158.m_OutFile;
  local_158.m_ADesc.EditRate.Numerator = 0;
  local_158.m_ADesc.EditRate.Denominator = 0;
  local_158.m_ADesc.AudioSamplingRate.Numerator = 0;
  local_158.m_ADesc.AudioSamplingRate.Denominator = 0;
  local_158.m_OutFile.super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>._M_impl.
  _M_node._M_size = 0;
  local_158.m_ChannelCount = 0;
  if (*(int *)((long)&fileReaderFactory[5]._vptr_IFileReaderFactory + 4) == 0 &&
      *(int *)&fileReaderFactory[5]._vptr_IFileReaderFactory == 0) {
    fileReaderFactory[5]._vptr_IFileReaderFactory = ASDCP::EditRate_24;
  }
  local_158.m_OutFile.super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       local_158.m_OutFile.super__List_base<WavFileElement_*,_std::allocator<WavFileElement_*>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2e0,(char *)fileReaderFactory[0xb]._vptr_IFileReaderFactory,
             (allocator<char> *)&local_1c8);
  this_01 = (string *)local_230;
  AS_02::PCM::MXFReader::OpenRead(this_01,(Rational *)local_320);
  if (local_2e0._0_8_ != (long)local_2e0 + 0x10) {
    operator_delete((void *)local_2e0._0_8_,(ulong)(local_2e0._16_8_ + 1));
  }
  if (-1 < local_230[0]) {
    if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
      read_PCM_file();
    }
    local_1c8 = (_func_int **)0x0;
    plVar5 = (long *)AS_02::PCM::MXFReader::OP1aHeader();
    MVar3 = ASDCP::DefaultCompositeDict();
    uVar6 = ASDCP::Dictionary::Type(MVar3);
    (**(code **)(*plVar5 + 0xa8))(local_2e0,plVar5,uVar6,&local_1c8);
    this_01 = (string *)local_230;
    Kumu::Result_t::operator=((Result_t *)this_01,(Result_t *)local_2e0);
    Kumu::Result_t::~Result_t((Result_t *)local_2e0);
    if (-1 < local_230[0]) {
      if ((local_1c8 == (_func_int **)0x0) ||
         (pAVar7 = (AudioDescriptor *)
                   __dynamic_cast(local_1c8,&ASDCP::MXF::InterchangeObject::typeinfo,
                                  &ASDCP::MXF::WaveAudioDescriptor::typeinfo,0),
         pAVar7 == (AudioDescriptor *)0x0)) {
        read_PCM_file();
LAB_00109808:
        Kumu::Result_t::Result_t((Result_t *)local_320._16_8_,(Result_t *)&Kumu::RESULT_FAIL);
        pCVar11 = (CommandOptions *)local_320._16_8_;
        goto LAB_00109a47;
      }
      if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
        (**(code **)((long)pAVar7->EditRate + 0x88))(pAVar7,0);
      }
      RVar9 = pAVar7[5].AudioSamplingRate;
      if (RVar9 == (Rational)0x0) {
        fwrite("ContainerDuration not set in file descriptor, attempting to use index duration.\n",
               0x50,1,_stderr);
        AS_02::PCM::MXFReader::AS02IndexReader();
        RVar9 = (Rational)AS_02::MXF::AS02IndexReader::GetDuration();
LAB_001094bd:
        if (RVar9.Numerator == 0) goto LAB_0010982e;
      }
      else {
        if ((char)pAVar7[5].Locked == '\x01') goto LAB_001094bd;
LAB_0010982e:
        fwrite("ContainerDuration not set in index, attempting to use Duration from SourceClip.\n",
               0x50,1,_stderr);
        plVar5 = (long *)AS_02::PCM::MXFReader::OP1aHeader();
        MVar3 = ASDCP::DefaultCompositeDict();
        uVar6 = ASDCP::Dictionary::Type(MVar3);
        (**(code **)(*plVar5 + 0xa8))(local_2e0,plVar5,uVar6,&local_1c8);
        Kumu::Result_t::operator=((Result_t *)local_230,(Result_t *)local_2e0);
        Kumu::Result_t::~Result_t((Result_t *)local_2e0);
        if (((local_230[0] < 0) ||
            (lVar8 = __dynamic_cast(local_1c8,&ASDCP::MXF::InterchangeObject::typeinfo,
                                    &ASDCP::MXF::SourceClip::typeinfo,0),
            *(char *)(lVar8 + 200) == '\0')) ||
           (RVar9.Denominator = 0, RVar9.Numerator = *(uint *)(lVar8 + 0xc0),
           *(uint *)(lVar8 + 0xc0) == 0)) {
          read_PCM_file();
          goto LAB_00109808;
        }
      }
      auVar15._0_8_ = (double)pAVar7[7].AudioSamplingRate.Numerator;
      auVar15._8_8_ = (double)*(int *)&fileReaderFactory[5]._vptr_IFileReaderFactory;
      dVar14 = (double)*(int *)((long)&fileReaderFactory[5]._vptr_IFileReaderFactory + 4);
      auVar16._8_4_ = SUB84(dVar14,0);
      auVar16._0_8_ = (double)pAVar7[7].AudioSamplingRate.Denominator;
      auVar16._12_4_ = (int)((ulong)dVar14 >> 0x20);
      auVar16 = divpd(auVar15,auVar16);
      ceil(auVar16._0_8_ / auVar16._8_8_);
      ASDCP::FrameBuffer::Capacity((int)local_100 + 0x68);
      Kumu::Result_t::~Result_t((Result_t *)(local_100 + 0x68));
      if (-1 < local_230[0]) {
        auVar17._0_8_ = (double)pAVar7[7].AudioSamplingRate.Numerator;
        auVar17._8_8_ = (double)*(int *)&fileReaderFactory[5]._vptr_IFileReaderFactory;
        dVar14 = (double)*(int *)((long)&fileReaderFactory[5]._vptr_IFileReaderFactory + 4);
        auVar2._8_4_ = SUB84(dVar14,0);
        auVar2._0_8_ = (double)pAVar7[7].AudioSamplingRate.Denominator;
        auVar2._12_4_ = (int)((ulong)dVar14 >> 0x20);
        auVar16 = divpd(auVar17,auVar2);
        dVar14 = ceil(auVar16._0_8_ / auVar16._8_8_);
        uVar4 = ((int)(((ulong)RVar9 & 0xffffffff) / ((long)dVar14 & 0xffffffffU)) + 1) -
                (uint)((int)(((ulong)RVar9 & 0xffffffff) % ((long)dVar14 & 0xffffffffU)) == 0);
        uVar12 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
        uVar1 = *(uint *)&fileReaderFactory[3]._vptr_IFileReaderFactory;
        uVar10 = uVar4;
        if (uVar1 < uVar4) {
          uVar10 = uVar1;
        }
        if (uVar1 == 0) {
          uVar10 = uVar4;
        }
        if (uVar12 != 0) {
          if (uVar10 < uVar12) {
            read_PCM_file();
            this_01 = (string *)&Kumu::RESULT_FAIL;
            goto LAB_00109a37;
          }
          if (uVar10 + uVar12 < uVar10) {
            uVar10 = uVar10 + uVar12;
          }
        }
        local_1c8 = (_func_int **)0x0;
        uStack_1c0 = 0;
        ASDCP::MD_to_PCM_ADesc((WaveAudioDescriptor *)local_2e0,pAVar7);
        this_01 = (string *)local_230;
        Kumu::Result_t::operator=((Result_t *)this_01,(Result_t *)local_2e0);
        Kumu::Result_t::~Result_t((Result_t *)local_2e0);
        if (-1 < local_230[0]) {
          uVar10 = uVar10 - uVar12;
          local_1c8 = fileReaderFactory[5]._vptr_IFileReaderFactory;
          local_1a0 = uVar10;
          WavFileWriter::OpenWrite
                    ((WavFileWriter *)local_2e0,&local_158.m_ADesc,(char *)&local_1c8,
                     (SplitType_t)fileReaderFactory[6]._vptr_IFileReaderFactory);
          this_01 = (string *)local_230;
          Kumu::Result_t::operator=((Result_t *)this_01,(Result_t *)local_2e0);
          Kumu::Result_t::~Result_t((Result_t *)local_2e0);
          if (-1 < local_230[0]) {
            bVar13 = true;
            if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 1) == '\x01') {
              this = (AESDecContext *)operator_new(8);
              ASDCP::AESDecContext::AESDecContext(this);
              ASDCP::AESDecContext::InitKey(local_2e0);
              this_01 = (string *)local_230;
              Kumu::Result_t::operator=((Result_t *)this_01,(Result_t *)local_2e0);
              Kumu::Result_t::~Result_t((Result_t *)local_2e0);
              if (local_230[0] < 0) goto LAB_00109a37;
              if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 2) == '\x01') {
                ASDCP::WriterInfo::WriterInfo((WriterInfo *)local_2e0);
                AS_02::PCM::MXFReader::FillWriterInfo((WriterInfo *)local_100);
                Kumu::Result_t::~Result_t((Result_t *)local_100);
                if (local_29f == true) {
                  this_00 = (HMACContext *)operator_new(8);
                  ASDCP::HMACContext::HMACContext(this_00);
                  ASDCP::HMACContext::InitKey((uchar *)&local_1c8,(LabelSet_t)this_00);
                  Kumu::Result_t::operator=((Result_t *)local_230,(Result_t *)&local_1c8);
                  Kumu::Result_t::~Result_t((Result_t *)&local_1c8);
                }
                else {
                  read_PCM_file();
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_p != &local_248) {
                  operator_delete(local_258._M_p,local_248._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_278._M_p != &local_268) {
                  operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._M_p != &local_288) {
                  operator_delete(local_298._M_p,local_288._M_allocated_capacity + 1);
                }
                bVar13 = -1 < local_230[0];
              }
            }
            if (bVar13) {
              uVar12 = *(uint *)((long)&fileReaderFactory[2]._vptr_IFileReaderFactory + 4);
              this_01 = (string *)local_230;
              if (uVar12 < uVar10) {
                while( true ) {
                  AS_02::PCM::MXFReader::ReadFrame
                            ((uint)(WavFileWriter *)local_2e0,(FrameBuffer *)local_320,
                             (AESDecContext *)(ulong)uVar12,(HMACContext *)local_308);
                  Kumu::Result_t::operator=((Result_t *)this_01,(Result_t *)local_2e0);
                  Kumu::Result_t::~Result_t((Result_t *)local_2e0);
                  if (local_230[0] < 0) break;
                  if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
                    local_308._28_4_ = uVar12;
                    ASDCP::PCM::FrameBuffer::Dump((_IO_FILE *)local_308,(uint)_stderr);
                  }
                  if (local_308._24_4_ != local_308._16_4_) {
                    read_PCM_file();
                  }
                  WavFileWriter::WriteFrame((WavFileWriter *)local_2e0,(FrameBuffer *)&local_158);
                  Kumu::Result_t::operator=((Result_t *)this_01,(Result_t *)local_2e0);
                  Kumu::Result_t::~Result_t((Result_t *)local_2e0);
                  if ((local_230[0] < 0) || (uVar12 = uVar12 + 1, uVar10 <= uVar12)) break;
                }
              }
            }
            else {
              this_01 = (string *)local_230;
            }
          }
        }
      }
    }
  }
LAB_00109a37:
  pCVar11 = (CommandOptions *)local_320._16_8_;
  Kumu::Result_t::Result_t((Result_t *)local_320._16_8_,(Result_t *)this_01);
LAB_00109a47:
  Kumu::Result_t::~Result_t((Result_t *)local_230);
  WavFileWriter::~WavFileWriter(&local_158);
  ASDCP::FrameBuffer::~FrameBuffer((FrameBuffer *)local_308);
  AS_02::PCM::MXFReader::~MXFReader((MXFReader *)local_320);
  return pCVar11;
}

Assistant:

Result_t
read_PCM_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*     Context = 0;
  HMACContext*       HMAC = 0;
  AS_02::PCM::MXFReader     Reader(fileReaderFactory);
  PCM::FrameBuffer   FrameBuffer;
  WavFileWriter      OutWave;
  ui32_t last_frame = 0;
  ASDCP::MXF::WaveAudioDescriptor *wave_descriptor = 0;

  if ( Options.edit_rate == ASDCP::Rational(0,0) ) // todo, make this available to the CLI
    {
      Options.edit_rate = EditRate_24;
    }

  Result_t result = Reader.OpenRead(Options.input_filename, Options.edit_rate);

  if ( KM_SUCCESS(result) )
    {
      if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	}
      
      ASDCP::MXF::InterchangeObject* tmp_obj = 0;

      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_WaveAudioDescriptor), &tmp_obj);

      if ( KM_SUCCESS(result) )
	{
	  wave_descriptor = dynamic_cast<ASDCP::MXF::WaveAudioDescriptor*>(tmp_obj);

	  if ( wave_descriptor == 0 )
	    {
	      fprintf(stderr, "File does not contain an essence descriptor.\n");
	      return RESULT_FAIL;
	    }
      
	  if ( Options.verbose_flag )
	    {
	      wave_descriptor->Dump();
	    }

	  if ( wave_descriptor->ContainerDuration.get() == 0 )
	    {
	      fprintf(stderr, "ContainerDuration not set in file descriptor, attempting to use index duration.\n");
	      last_frame = Reader.AS02IndexReader().GetDuration();
	    }
	  else
	    {
              if ( ! wave_descriptor->ContainerDuration.empty() )
                {
	          last_frame = (ui32_t)wave_descriptor->ContainerDuration;
                }
	    }

	  if ( last_frame == 0 )
	    {
	      fprintf(stderr, "ContainerDuration not set in index, attempting to use Duration from SourceClip.\n");
	      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_SourceClip), &tmp_obj);
	      if ( KM_SUCCESS(result))
		{
	    	  ASDCP::MXF::SourceClip *sourceClip = dynamic_cast<ASDCP::MXF::SourceClip*>(tmp_obj);
	    	  if ( ! sourceClip->Duration.empty() )
		    {
		      last_frame = (ui32_t)sourceClip->Duration;
		    }
		}
	    }

	  if ( last_frame == 0 )
	    {
	      fprintf(stderr, "Unable to determine file duration.\n");
	      return RESULT_FAIL;
	    }

	  assert(wave_descriptor);
	  FrameBuffer.Capacity(AS_02::MXF::CalcFrameBufferSize(*wave_descriptor, Options.edit_rate));
	  last_frame = AS_02::MXF::CalcFramesFromDurationInSamples(last_frame, *wave_descriptor, Options.edit_rate);
	}
    }

  if ( ASDCP_SUCCESS(result) )
    {
      if ( Options.duration > 0 && Options.duration < last_frame )
	last_frame = Options.duration;

      if ( Options.start_frame > 0 )
	{
	  if ( Options.start_frame > last_frame )
	    {
	      fprintf(stderr, "Start value greater than file duration.\n");
	      return RESULT_FAIL;
	    }

	  last_frame = Kumu::xmin(Options.start_frame + last_frame, last_frame);
	}

      last_frame = last_frame - Options.start_frame;

      PCM::AudioDescriptor ADesc;

      result = MD_to_PCM_ADesc(wave_descriptor, ADesc);

      if ( ASDCP_SUCCESS(result) )
	{
	  ADesc.ContainerDuration = last_frame;
	  ADesc.EditRate = Options.edit_rate;

	  result = OutWave.OpenWrite(ADesc, Options.file_prefix,
				     ( Options.split_wav ? WavFileWriter::ST_STEREO : 
				       ( Options.mono_wav ? WavFileWriter::ST_MONO : WavFileWriter::ST_NONE ) ));
	}
    }

#ifdef HAVE_OPENSSL
  if ( ASDCP_SUCCESS(result) && Options.key_flag )
    {
      Context = new AESDecContext;
      result = Context->InitKey(Options.key_value);

      if ( ASDCP_SUCCESS(result) && Options.read_hmac )
	{
	  WriterInfo Info;
	  Reader.FillWriterInfo(Info);

	  if ( Info.UsesHMAC )
	    {
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	  else
	    {
	      fputs("File does not contain HMAC values, ignoring -m option.\n", stderr);
	    }
	}
    }
#endif // HAVE_OPENSSL

  for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
      result = Reader.ReadFrame(i, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( Options.verbose_flag )
	    {
	      FrameBuffer.FrameNumber(i);
	      FrameBuffer.Dump(stderr, Options.fb_dump_size);
	    }

	  if ( FrameBuffer.Size() != FrameBuffer.Capacity() )
	    {
	      fprintf(stderr, "Last frame is incomplete, padding with zeros.\n");
	      // actually, it has already been zeroed for us, we just need to recognize the appropriate size
	      FrameBuffer.Size(FrameBuffer.Capacity());
	    }

	  result = OutWave.WriteFrame(FrameBuffer);
	}
    }

  return result;
}